

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  char *pcVar3;
  float fVar4;
  FastAllocator *this_00;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_01;
  Scene *pSVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  MutexSys *pMVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  long lVar27;
  float *pfVar28;
  ulong uVar29;
  long lVar30;
  vuint<4> vgeomID;
  Lock<embree::MutexSys> local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Lock<embree::MutexSys> local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  BVHNBuilderT<embree::sse2::CreateLeafSpatial<4,_embree::TriangleMv<4>_>_> *local_88;
  range<unsigned_long> *local_80;
  value_type local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  vuint<4> vprimID;
  
  uVar24 = set->_begin;
  uVar21 = (set->_end - uVar24) + 3 >> 2;
  vgeomID.field_0.v[0] = uVar21 * 0xb0;
  this_00 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_01 = pTVar5->parent;
  local_88 = this;
  local_80 = set;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_b8.locked = true;
    local_b8.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_e8.locked = true;
    local_78 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_78);
    Lock<embree::MutexSys>::~Lock(&local_e8);
    Lock<embree::MutexSys>::~Lock(&local_b8);
  }
  uVar20 = vgeomID.field_0.v[0];
  pTVar5->bytesUsed = pTVar5->bytesUsed + vgeomID.field_0.v[0];
  sVar25 = pTVar5->cur;
  uVar26 = (ulong)(-(int)sVar25 & 0xf);
  uVar22 = sVar25 + vgeomID.field_0.v[0] + uVar26;
  pTVar5->cur = uVar22;
  if (pTVar5->end < uVar22) {
    pTVar5->cur = sVar25;
    pMVar10 = (MutexSys *)pTVar5->allocBlockSize;
    if ((MutexSys *)(vgeomID.field_0.v[0] * 4) < pMVar10 ||
        (long)(vgeomID.field_0.v[0] * 4) - (long)pMVar10 == 0) {
      local_e8.mutex = pMVar10;
      pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar5->ptr = pcVar23;
      sVar25 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar25;
      pTVar5->end = (size_t)local_e8.mutex;
      pTVar5->cur = uVar20;
      if (local_e8.mutex < (ulong)uVar20) {
        pTVar5->cur = 0;
        local_e8.mutex = (MutexSys *)pTVar5->allocBlockSize;
        pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar5->ptr = pcVar23;
        sVar25 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar25;
        pTVar5->end = (size_t)local_e8.mutex;
        pTVar5->cur = uVar20;
        if (local_e8.mutex < (ulong)uVar20) {
          pTVar5->cur = 0;
          pcVar23 = (char *)0x0;
          goto LAB_004918cf;
        }
      }
      pTVar5->bytesWasted = sVar25;
    }
    else {
      pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar26;
    pcVar23 = pTVar5->ptr + (uVar22 - vgeomID.field_0._0_8_);
  }
LAB_004918cf:
  for (uVar22 = 0; uVar22 != uVar21; uVar22 = uVar22 + 1) {
    uVar26 = local_80->_end;
    pSVar6 = ((local_88->createLeafFunc).bvh)->scene;
    vgeomID.field_0.v[0] = -1;
    vgeomID.field_0.i[2] = 0xffffffff;
    vgeomID.field_0.i[3] = 0xffffffff;
    vprimID.field_0.i[0] = 0xffffffff;
    vprimID.field_0.i[1] = 0xffffffff;
    vprimID.field_0.i[2] = 0xffffffff;
    vprimID.field_0.i[3] = 0xffffffff;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8.mutex = (MutexSys *)0x0;
    local_e8.locked = false;
    local_e8._9_7_ = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8.mutex = (MutexSys *)0x0;
    local_b8.locked = false;
    local_b8._9_7_ = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = (value_type)0x0;
    uStack_70 = 0;
    pfVar28 = prims[uVar24].upper.field_0.m128 + 3;
    for (uVar29 = 0; (uVar29 < 4 && (uVar24 + uVar29 < uVar26)); uVar29 = uVar29 + 1) {
      fVar4 = *pfVar28;
      pGVar7 = (pSVar6->geometries).items[(uint)pfVar28[-4]].ptr;
      lVar30 = (ulong)(uint)fVar4 *
               pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar27 = *(long *)&pGVar7->field_0x58;
      lVar8 = *(long *)&pGVar7[1].time_range.upper;
      p_Var9 = pGVar7[1].intersectionFilterN;
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar27 + lVar30) * (long)p_Var9);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      uVar13 = puVar2[2];
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar27 + 4 + lVar30) * (long)p_Var9);
      uVar14 = *puVar2;
      uVar15 = puVar2[1];
      uVar16 = puVar2[2];
      puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar27 + 8 + lVar30) * (long)p_Var9);
      uVar17 = *puVar2;
      uVar18 = puVar2[1];
      uVar19 = puVar2[2];
      vgeomID.field_0.i[uVar29] = (uint)pfVar28[-4];
      vprimID.field_0.i[uVar29] = (uint)fVar4;
      *(undefined4 *)((long)&local_e8.mutex + uVar29 * 4) = uVar11;
      *(undefined4 *)((long)&local_d8 + uVar29 * 4) = uVar12;
      *(undefined4 *)((long)&local_c8 + uVar29 * 4) = uVar13;
      *(undefined4 *)((long)&local_b8.mutex + uVar29 * 4) = uVar14;
      *(undefined4 *)((long)&local_a8 + uVar29 * 4) = uVar15;
      *(undefined4 *)((long)&local_98 + uVar29 * 4) = uVar16;
      *(undefined4 *)((long)&local_78 + uVar29 * 4) = uVar17;
      *(undefined4 *)((long)&local_68 + uVar29 * 4) = uVar18;
      *(undefined4 *)((long)&local_58 + uVar29 * 4) = uVar19;
      pfVar28 = pfVar28 + 8;
    }
    lVar27 = uVar22 * 0xb0;
    pcVar3 = pcVar23 + lVar27;
    *(MutexSys **)pcVar3 = local_e8.mutex;
    pcVar3[8] = local_e8.locked;
    pcVar3[9] = local_e8._9_1_;
    pcVar3[10] = local_e8._10_1_;
    pcVar3[0xb] = local_e8._11_1_;
    pcVar3[0xc] = local_e8._12_1_;
    pcVar3[0xd] = local_e8._13_1_;
    pcVar3[0xe] = local_e8._14_1_;
    pcVar3[0xf] = local_e8._15_1_;
    *(undefined8 *)(pcVar23 + lVar27 + 0x10) = local_d8;
    *(undefined8 *)(pcVar23 + lVar27 + 0x10 + 8) = uStack_d0;
    *(undefined8 *)(pcVar23 + lVar27 + 0x20) = local_c8;
    *(undefined8 *)(pcVar23 + lVar27 + 0x20 + 8) = uStack_c0;
    pcVar3 = pcVar23 + lVar27 + 0x30;
    *(MutexSys **)pcVar3 = local_b8.mutex;
    pcVar3[8] = local_b8.locked;
    pcVar3[9] = local_b8._9_1_;
    pcVar3[10] = local_b8._10_1_;
    pcVar3[0xb] = local_b8._11_1_;
    pcVar3[0xc] = local_b8._12_1_;
    pcVar3[0xd] = local_b8._13_1_;
    pcVar3[0xe] = local_b8._14_1_;
    pcVar3[0xf] = local_b8._15_1_;
    *(undefined8 *)(pcVar23 + lVar27 + 0x40) = local_a8;
    *(undefined8 *)(pcVar23 + lVar27 + 0x40 + 8) = uStack_a0;
    *(undefined8 *)(pcVar23 + lVar27 + 0x50) = local_98;
    *(undefined8 *)(pcVar23 + lVar27 + 0x50 + 8) = uStack_90;
    *(value_type *)(pcVar23 + lVar27 + 0x60) = local_78;
    *(undefined8 *)(pcVar23 + lVar27 + 0x60 + 8) = uStack_70;
    *(undefined8 *)(pcVar23 + lVar27 + 0x70) = local_68;
    *(undefined8 *)(pcVar23 + lVar27 + 0x70 + 8) = uStack_60;
    *(undefined8 *)(pcVar23 + lVar27 + 0x80) = local_58;
    *(undefined8 *)(pcVar23 + lVar27 + 0x80 + 8) = uStack_50;
    *(longlong *)(pcVar23 + lVar27 + 0x90) = vgeomID.field_0.v[0];
    *(longlong *)((long)(pcVar23 + lVar27 + 0x90) + 8) =
         CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
    *(ulong *)(pcVar23 + lVar27 + 0xa0) = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
    *(ulong *)(pcVar23 + lVar27 + 0xa0 + 8) = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
    uVar24 = uVar24 + uVar29;
  }
  uVar24 = 7;
  if (uVar21 < 7) {
    uVar24 = uVar21;
  }
  return (NodeRef)(uVar24 | (ulong)pcVar23 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }